

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_egads.c
# Opt level: O3

REF_STATUS ref_egads_brep_reface(REF_GEOM ref_geom,REF_INT faceid,REF_BOOL debug)

{
  printf("nothing for %s, full EGADS not linked\n","ref_egads_brep_reface");
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_egads_brep_reface(REF_GEOM ref_geom, REF_INT faceid,
                                         REF_BOOL debug) {
#if defined(HAVE_EGADS) && !defined(HAVE_EGADS_LITE)
  ego face, newface;
  ego surface;
  int faceclass, facetype;
  double facebounds[4];
  int nloop;
  ego *loops;
  int *loopsenses;
  int face_geom_class, face_geom_type;
  int iloop;
  REF_BOOL verbose = REF_TRUE;

  face = ((ego *)(ref_geom->faces))[faceid - 1];
  REIS(EGADS_SUCCESS,
       EG_getTopology(face, &surface, &faceclass, &facetype, facebounds, &nloop,
                      &loops, &loopsenses),
       "topo");
  /* copy loop to new ego array, currently point to internal struct */
  face_geom_class = REF_EMPTY;
  face_geom_type = REF_EMPTY;
  if (NULL != surface) {
    int *geom_ints;
    double *geom_reals;
    ego surface_ref;
    REIS(EGADS_SUCCESS,
         EG_getGeometry(surface, &face_geom_class, &face_geom_type,
                        &surface_ref, &geom_ints, &geom_reals),
         "topo");
    EG_free(geom_ints);
    EG_free(geom_reals);
  }
  if (verbose)
    printf("faceid %d class %d type %d surface class %d type %d nloop %d\n",
           faceid, faceclass, facetype, face_geom_class, face_geom_type, nloop);
  {
    ego *oldloops;
    int *oldloopsenses;
    oldloops = loops;
    ref_malloc(loops, nloop, ego);
    for (iloop = 0; iloop < nloop; iloop++) {
      loops[iloop] = oldloops[iloop];
    }
    oldloopsenses = loopsenses;
    ref_malloc(loopsenses, nloop, int);
    for (iloop = 0; iloop < nloop; iloop++) {
      loopsenses[iloop] = oldloopsenses[iloop];
    }
  }
  for (iloop = 0; iloop < nloop; iloop++) {
    ego loop_ref, *children;
    int nchild, *children_senses, loopclass, looptype;

    /* loop through all Edges associated with this Loop */
    REIS(EGADS_SUCCESS,
         EG_getTopology(loops[iloop], &loop_ref, &loopclass, &looptype, NULL,
                        &nchild, &children, &children_senses),
         "topo");
    /* steinmetz face 8 RAS(NULL == loop_ref, "loop ref not null"); */
    if (verbose)
      printf(" loop %d class %d type %d nchild %d\n", iloop + 1, loopclass,
             looptype, nchild);
    {
      int iedge;
      int childsize;
      ego *oldchildren;
      int *oldchildren_senses;
      if (REF_EMPTY != face_geom_type && PLANE != face_geom_type) {
        childsize = 2 * nchild;
      } else {
        childsize = nchild;
      }
      oldchildren = children;
      ref_malloc(children, childsize, ego);
      for (iedge = 0; iedge < childsize; iedge++) {
        children[iedge] = oldchildren[iedge];
      }
      oldchildren_senses = children_senses;
      ref_malloc(children_senses, nchild, int);
      for (iedge = 0; iedge < nchild; iedge++) {
        children_senses[iedge] = oldchildren_senses[iedge];
      }
    }
    if (REF_EMPTY != face_geom_type && PLANE != face_geom_type) {
      int iedge, ipc;
      for (iedge = 0; iedge < nchild; iedge++) {
        int pcurveclass, pcurvetype;
        int *pcurve_ints;
        double *pcurve_reals;
        ego pcurve_ref = NULL;
        ego pcurve, edge;
        ipc = iedge + nchild;
        edge = children[iedge];
        pcurve = children[ipc];
        REIS(EGADS_SUCCESS,
             EG_getGeometry(pcurve, &pcurveclass, &pcurvetype, &pcurve_ref,
                            &pcurve_ints, &pcurve_reals),
             "topo");
        RAS(NULL == pcurve_ref, "pcurve ref not null");
        if (verbose)
          printf("  pcurve %d class %d type %d\n", iedge + 1, pcurveclass,
                 pcurvetype);
        if (PCURVE == pcurveclass && BSPLINE == pcurvetype) {
          printf("    bit flag %d deg %d ncp %d nkt %d\n", pcurve_ints[0],
                 pcurve_ints[1], pcurve_ints[2], pcurve_ints[3]);
          REIS(pcurve_ints[3], pcurve_ints[2] + pcurve_ints[1] + 1,
               "nknot != ncp+deg+1");
          {
            REF_INT degree;
            REF_INT n_control_point;
            REF_INT edgeid;
            int *int_bundle;
            double *dbl_bundle;
            degree = 3;
            n_control_point = MAX(8, pcurve_ints[2]);
            edgeid = EG_indexBodyTopo((ego)(ref_geom->body), edge);
            if (debug) {
              char filename[1024];
              snprintf(filename, 1024, "re-orig%d-edge%d.tec", faceid, edgeid);
              RSS(ref_geom_bspline_bundle_on_tec(ref_geom, pcurve_ints[1],
                                                 pcurve_ints[2], pcurve_reals,
                                                 faceid, filename),
                  "tec on face");
              snprintf(filename, 1024, "re-edge-edge%d.tec", edgeid);
              RSS(ref_geom_edge_tec(ref_geom, edgeid, filename), "tec on edge");
              snprintf(filename, 1024, "re-node.tec");
              RSS(ref_geom_node_tec(ref_geom, filename), "tec on node");
            }
            RSS(ref_egads_brep_pcurve(ref_geom, edgeid, faceid, degree,
                                      n_control_point, &int_bundle,
                                      &dbl_bundle),
                "bspline fit");
            EG_free(pcurve_ints);
            EG_free(pcurve_reals);
            pcurve_ints = int_bundle;
            pcurve_reals = dbl_bundle;
            if (debug) {
              char filename[1024];
              snprintf(filename, 1024, "re-face%d-edge%d.tec", faceid, edgeid);
              RSS(ref_geom_bspline_bundle_on_tec(ref_geom, pcurve_ints[1],
                                                 pcurve_ints[2], pcurve_reals,
                                                 faceid, filename),
                  "tec on face");
            }
          }
          printf("    new flag %d deg %d ncp %d nkt %d\n", pcurve_ints[0],
                 pcurve_ints[1], pcurve_ints[2], pcurve_ints[3]);
          REIS(pcurve_ints[3], pcurve_ints[2] + pcurve_ints[1] + 1,
               "nknot != ncp+deg+1");
          REIS(
              EGADS_SUCCESS,
              EG_makeGeometry((ego)(ref_geom->context), pcurveclass, pcurvetype,
                              pcurve_ref, pcurve_ints, pcurve_reals, &pcurve),
              "topo");
          children[ipc] = pcurve;
        }
        EG_free(pcurve_ints);
        EG_free(pcurve_reals);
      }
    }
    {
      int iedge, ipc;
      for (iedge = 0; iedge < nchild; iedge++) {
        int pcurveclass, pcurvetype;
        int *pcurve_ints;
        double *pcurve_reals;
        ego pcurve_ref = NULL;
        ego edge_ref = NULL, *edgechildren;
        int edgeclass, edgetype, *edgechildren_senses;
        int nedgechild;
        REF_BOOL viz = REF_FALSE;
        ego pcurve, edge;
        ipc = iedge + nchild;
        edge = children[iedge];
        pcurve = children[ipc];
        REIS(EGADS_SUCCESS,
             EG_getTopology(edge, &edge_ref, &edgeclass, &edgetype, NULL,
                            &nedgechild, &edgechildren, &edgechildren_senses),
             "edge topo");
        printf("  edge %d class %d type %d nchild %d\n", iedge + 1, edgeclass,
               edgetype, nedgechild);
        REIS(EGADS_SUCCESS,
             EG_getGeometry(pcurve, &pcurveclass, &pcurvetype, &pcurve_ref,
                            &pcurve_ints, &pcurve_reals),
             "pcurve geom");
        if (PCURVE == pcurveclass && BSPLINE == pcurvetype) {
          printf("  pcurve %d class %d type %d\n", iedge + 1, pcurveclass,
                 pcurvetype);
          printf("    dup flag %d deg %d ncp %d nkt %d\n", pcurve_ints[0],
                 pcurve_ints[1], pcurve_ints[2], pcurve_ints[3]);
          if (viz) {
            char filename[1024];
            snprintf(filename, 1024, "pcurve-%d.tec", iedge);
            RSS(ref_geom_bspline_bundle_tec(pcurve_ints[0], pcurve_ints[1],
                                            pcurve_reals, filename),
                "tec basis");
          }
        }
      }
    }

    RSS(ref_egads_out_level(ref_geom, 3), "verbose");
    REIB(EGADS_SUCCESS,
         EG_makeTopology((ego)(ref_geom->context), loop_ref, loopclass,
                         looptype, NULL, nchild, children, children_senses,
                         &(loops[iloop])),
         "make topo loop", {
           printf("loop %d ref %p surface %p class %d type %d nchild %d\n",
                  iloop, (void *)loop_ref, (void *)surface, loopclass, looptype,
                  nchild);
         });
    RSS(ref_egads_out_level(ref_geom, 0), "quiet");
  }
  REIS(EGADS_SUCCESS,
       EG_makeTopology((ego)(ref_geom->context), surface, faceclass, facetype,
                       facebounds, nloop, loops, loopsenses, &newface),
       "topo");
  {
    ego body;
    ego facepair[2];
    facepair[0] = face;
    facepair[1] = newface;
    REIS(EGADS_SUCCESS,
         EG_replaceFaces((ego)(ref_geom->body), 1, facepair, &body), "replace");
    ref_geom->body = (void *)body;
    {
      ego model;
      REIS(EGADS_SUCCESS,
           EG_makeTopology((ego)(ref_geom->context), NULL, MODEL, 0, NULL, 1,
                           &body, NULL, &model),
           "make Topo Model");
      ref_geom->model = (void *)model;
    }
    RSS(ref_egads_free_body_objects(ref_geom), "free before new cache");
    RSS(ref_egads_cache_body_objects(ref_geom), "cache egads objects");
  }

#else
  printf("nothing for %s, full EGADS not linked\n", __func__);
  SUPRESS_UNUSED_COMPILER_WARNING(ref_geom);
  SUPRESS_UNUSED_COMPILER_WARNING(faceid);
  SUPRESS_UNUSED_COMPILER_WARNING(debug);
#endif
  return REF_SUCCESS;
}